

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

node_t_conflict
process_tag(c2m_ctx_t c2m_ctx,node_t_conflict r,node_t_conflict id,node_t_conflict decl_list)

{
  size_t sVar1;
  size_t sVar2;
  symbol_t el_00;
  uint uVar3;
  node_t_conflict pnVar4;
  char *pcVar5;
  char *pcVar6;
  node_t_conflict scope;
  pos_t pVar7;
  symbol_t el;
  undefined4 uStack_94;
  undefined8 uStack_80;
  undefined8 uStack_78;
  VARR_node_t *pVStack_70;
  symbol_t local_68;
  
  if (id->code == N_ID) {
    for (scope = c2m_ctx->check_ctx->curr_scope;
        (scope != c2m_ctx->top_scope && ((scope->code & ~N_I) == N_STRUCT));
        scope = *(node_t_conflict *)((long)scope->attr + 0x20)) {
    }
    if (decl_list->code == N_IGNORE) {
      pnVar4 = find_def(c2m_ctx,S_TAG,id,scope,(node_t_conflict *)0x0);
      uVar3 = (uint)(pnVar4 != (node_t_conflict)0x0);
    }
    else {
      el_00._4_4_ = uStack_94;
      el_00.mode = 1;
      el_00.id = id;
      el_00.scope = scope;
      el_00.def_node = (node_t_conflict)uStack_80;
      el_00.aux_node = (node_t_conflict)uStack_78;
      el_00.defs = pVStack_70;
      uVar3 = HTAB_symbol_t_do(c2m_ctx->symbol_tab,el_00,HTAB_FIND,&local_68);
      pnVar4 = (node_t_conflict)0x0;
      if (uVar3 != 0) {
        pnVar4 = local_68.def_node;
      }
    }
    if (uVar3 == 0) {
      symbol_insert(c2m_ctx,S_TAG,id,scope,r,(node_t_conflict)0x0);
    }
    else {
      if (pnVar4->code == r->code) {
        if (((((pnVar4->u).ops.head)->op_link).next)->code == N_IGNORE) {
          if (decl_list->code == N_IGNORE) {
            return pnVar4;
          }
          pcVar6 = (r->u).s.s;
          sVar1 = (r->u).s.len;
          sVar2 = (pnVar4->u).s.len;
          (r->u).s.s = (pnVar4->u).s.s;
          (r->u).s.len = sVar2;
          (pnVar4->u).s.s = pcVar6;
          (pnVar4->u).s.len = sVar1;
          return pnVar4;
        }
        if (decl_list->code == N_IGNORE) {
          return pnVar4;
        }
        pVar7 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,(node_t_conflict)(ulong)id->uid);
        pcVar6 = (id->u).s.s;
        pcVar5 = "tag %s redeclaration";
      }
      else {
        pVar7 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,(node_t_conflict)(ulong)id->uid);
        pcVar6 = (id->u).s.s;
        pcVar5 = "kind of tag %s is unmatched with previous declaration";
      }
      error(c2m_ctx,pcVar5,pVar7.fname,pVar7._8_8_,pcVar6);
    }
  }
  return r;
}

Assistant:

static node_t process_tag (c2m_ctx_t c2m_ctx, node_t r, node_t id, node_t decl_list) {
  check_ctx_t check_ctx = c2m_ctx->check_ctx;
  symbol_t sym;
  int found_p;
  node_t scope, tab_decl_list;

  if (id->code != N_ID) return r;
  scope = curr_scope;
  while (scope != top_scope && (scope->code == N_STRUCT || scope->code == N_UNION))
    scope = ((struct node_scope *) scope->attr)->scope;
  sym.def_node = NULL; /* to remove uninitialized warning */
  if (decl_list->code != N_IGNORE) {
    found_p = symbol_find (c2m_ctx, S_TAG, id, scope, &sym);
  } else {
    sym.def_node = find_def (c2m_ctx, S_TAG, id, scope, NULL);
    found_p = sym.def_node != NULL;
  }
  if (!found_p) {
    symbol_insert (c2m_ctx, S_TAG, id, scope, r, NULL);
  } else if (sym.def_node->code != r->code) {
    error (c2m_ctx, POS (id), "kind of tag %s is unmatched with previous declaration", id->u.s.s);
  } else if ((tab_decl_list = NL_EL (sym.def_node->u.ops, 1))->code != N_IGNORE
             && decl_list->code != N_IGNORE) {
    error (c2m_ctx, POS (id), "tag %s redeclaration", id->u.s.s);
  } else {
    if (decl_list->code != N_IGNORE) { /* swap decl lists */
      DLIST (node_t) temp;
      SWAP (r->u.ops, sym.def_node->u.ops, temp);
    }
    r = sym.def_node;
  }
  return r;
}